

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O0

void yy_syntax_error(yyParser *yypParser,int yymajor,int64_t yyminor)

{
  calculator_t *pcVar1;
  calculator_t *state;
  int64_t yyminor_local;
  int yymajor_local;
  yyParser *yypParser_local;
  
  pcVar1 = yypParser->state;
  pcVar1->error = 1;
  yypParser->state = pcVar1;
  return;
}

Assistant:

static void yy_syntax_error(
  yyParser *yypParser,           /* The parser */
  int yymajor,                   /* The major type of the error token */
  ParseTOKENTYPE yyminor         /* The minor type of the error token */
){
  ParseARG_FETCH
  ParseCTX_FETCH
#define TOKEN yyminor
/************ Begin %syntax_error code ****************************************/
#line 326 "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/calculator.lemon"

    state->error = 1;
#line 1249 "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/build_O0/calculator.c"
/************ End %syntax_error code ******************************************/
  ParseARG_STORE /* Suppress warning about unused %extra_argument variable */
  ParseCTX_STORE
}